

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricer_test.cc
# Opt level: O0

void __thiscall
fizplex::PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test::TestBody
          (PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  DVector *in_RDI;
  double **expected_predicate_value;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Candidate candidate;
  DVector d;
  DVector x;
  bool *in_stack_fffffffffffffec8;
  AssertionResult *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  iterator lhs_expression;
  AssertHelper in_stack_fffffffffffffef0;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  string local_e8;
  AssertHelper local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  LP *in_stack_ffffffffffffff50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  undefined8 local_78;
  iterator local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_40 = 0x3ff0000000000000;
  lhs_expression = (iterator)0xbff0000000000000;
  local_38 = 0xbff0000000000000;
  local_30 = &local_40;
  local_28 = 2;
  l._M_len = (size_type)in_stack_fffffffffffffef0.data_;
  l._M_array = (iterator)0xbff0000000000000;
  DVector::DVector(in_RDI,l);
  local_78 = 0;
  local_68 = &local_78;
  local_60 = 2;
  l_00._M_len = (size_type)in_stack_fffffffffffffef0.data_;
  l_00._M_array = lhs_expression;
  local_70 = lhs_expression;
  DVector::DVector(in_RDI,l_00);
  expected_predicate_value = &in_RDI[6].vals._M_data;
  Pricer::price((Pricer *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                (DVector *)in_stack_ffffffffffffff58.ptr_,in_stack_ffffffffffffff50,
                (DVector *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                in_stack_ffffffffffffff40.ptr_);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(type *)0x1d5829);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&stack0xffffffffffffff50,
               (AssertionResult *)"candidate.is_optimal","true","false",
               (char *)expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&stack0xffffffffffffff40);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message((Message *)0x1d5926);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5995);
  local_fc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((char *)lhs_expression,(char *)in_RDI,
             (unsigned_long *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             (uint *)in_stack_fffffffffffffed0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d5a24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffef0,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef0);
    testing::Message::~Message((Message *)0x1d5a72);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5abe);
  DVector::~DVector((DVector *)0x1d5acb);
  DVector::~DVector((DVector *)0x1d5ad8);
  return;
}

Assistant:

TEST_F(PricerTestTwoVars, NegCostAtLowerIsNotOptimal) {
  DVector x = {1.0, -1.0};
  DVector d = {0.0, -1.0};
  const auto candidate = p.price(x, lp, d, nbi);
  EXPECT_FALSE(candidate.is_optimal);
  EXPECT_EQ(candidate.index, 1u);
}